

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::FormatStrSS<std::__cxx11::stringstream,unsigned_long>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               MemorySizeFormatter<unsigned_long> *Arg)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined4 uVar11;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar1 = Arg->size;
  uVar3 = Arg->ref_size;
  if (Arg->ref_size == 0) {
    uVar3 = uVar1;
  }
  uVar11 = (undefined4)(uVar1 >> 0x20);
  uVar7 = (undefined4)uVar1;
  if (uVar3 < 0x40000000) {
    if (uVar3 < 0x100000) {
      if (uVar3 < 0x400) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
        pcVar6 = " Byte";
        if ((Arg->size & 1) == 0) {
          pcVar6 = " Bytes";
        }
        lVar5 = 6 - (ulong)((uint)Arg->size & 1);
        goto LAB_00253e74;
      }
      lVar5 = *(long *)(ss + 0x10);
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(ss + lVar2 + 0x28) = *(uint *)(ss + lVar2 + 0x28) & 0xfffffefb | 4;
      auVar10._8_4_ = uVar11;
      auVar10._0_8_ = uVar1;
      auVar10._12_4_ = 0x45300000;
      *(long *)(ss + *(long *)(lVar5 + -0x18) + 0x18) = (long)Arg->precision;
      poVar4 = std::ostream::_M_insert<double>
                         (((auVar10._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0)) * 0.0009765625)
      ;
      pcVar6 = " KB";
    }
    else {
      lVar5 = *(long *)(ss + 0x10);
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(ss + lVar2 + 0x28) = *(uint *)(ss + lVar2 + 0x28) & 0xfffffefb | 4;
      auVar9._8_4_ = uVar11;
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      *(long *)(ss + *(long *)(lVar5 + -0x18) + 0x18) = (long)Arg->precision;
      poVar4 = std::ostream::_M_insert<double>
                         (((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0)) *
                          9.5367431640625e-07);
      pcVar6 = " MB";
    }
  }
  else {
    lVar5 = *(long *)(ss + 0x10);
    lVar2 = *(long *)(lVar5 + -0x18);
    *(uint *)(ss + lVar2 + 0x28) = *(uint *)(ss + lVar2 + 0x28) & 0xfffffefb | 4;
    auVar8._8_4_ = uVar11;
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    *(long *)(ss + *(long *)(lVar5 + -0x18) + 0x18) = (long)Arg->precision;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0)) *
                        9.313225746154785e-10);
    pcVar6 = " GB";
  }
  lVar5 = 3;
LAB_00253e74:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const MemorySizeFormatter<Type>& Arg)
{
    auto ref_size = Arg.ref_size != 0 ? Arg.ref_size : Arg.size;
    if (ref_size >= (1 << 30))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 30} << " GB";
    }
    else if (ref_size >= (1 << 20))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 20} << " MB";
    }
    else if (ref_size >= (1 << 10))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 10} << " KB";
    }
    else
    {
        ss << Arg.size << (((Arg.size & 0x01) == 0x01) ? " Byte" : " Bytes");
    }
}